

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_event_wait(ma_event *pEvent)

{
  ma_event *pEvent_local;
  
  if ((pEvent == (ma_event *)0x0) || (pEvent->pContext == (ma_context *)0x0)) {
    pEvent_local._4_4_ = 0;
  }
  else {
    pEvent_local._4_4_ = ma_event_wait__posix(pEvent);
  }
  return pEvent_local._4_4_;
}

Assistant:

MA_API ma_bool32 ma_event_wait(ma_event* pEvent)
{
    if (pEvent == NULL || pEvent->pContext == NULL) {
        return MA_FALSE;
    }

#ifdef MA_WIN32
    return ma_event_wait__win32(pEvent);
#endif
#ifdef MA_POSIX
    return ma_event_wait__posix(pEvent);
#endif
}